

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plt-elf.c
# Opt level: O1

undefined1 * plt_get_real_fn(plt_ctx ctx,char *name)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  Elf64_Dyn *pEVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  link_map *plVar11;
  uint *puVar12;
  byte *pbVar13;
  uint uVar14;
  byte bVar15;
  Elf64_Dyn *pEVar16;
  uint *puVar17;
  Elf64_Dyn *pEVar18;
  ulong uVar19;
  uint *puVar20;
  uint *puVar21;
  ulong uVar22;
  bool bVar23;
  undefined1 *local_40;
  uint *local_38;
  
  plVar11 = ctx->r_map;
  if (plVar11 == (link_map *)0x0) {
    return (undefined1 *)0x0;
  }
LAB_001031b4:
  puVar4 = (uint *)plVar11->l_addr;
  pEVar5 = plVar11->l_ld;
  lVar6 = pEVar5->d_tag;
  pEVar16 = pEVar5;
  lVar7 = lVar6;
  while (pEVar18 = pEVar5, lVar8 = lVar6, lVar7 != 0) {
    if (lVar7 == 6) {
      puVar20 = (uint *)(pEVar16->d_un).d_val;
      if ((uint *)0xfeffffffffffffff < puVar20 || puVar20 < puVar4) {
        puVar20 = (uint *)((long)puVar20 + (long)puVar4);
      }
      goto joined_r0x001031eb;
    }
    lVar7 = pEVar16[1].d_tag;
    pEVar16 = pEVar16 + 1;
  }
  puVar20 = (uint *)0x0;
joined_r0x001031eb:
  do {
    if (lVar8 == 0) break;
    pEVar16 = pEVar18 + 1;
    if (lVar8 == 5) {
      puVar21 = (uint *)(pEVar18->d_un).d_val;
      if ((uint *)0xfeffffffffffffff < puVar21 || puVar21 < puVar4) {
        puVar21 = (uint *)((long)puVar21 + (long)puVar4);
      }
      goto LAB_0010320d;
    }
    pEVar18 = pEVar16;
    lVar8 = pEVar16->d_tag;
  } while( true );
  puVar21 = (uint *)0x0;
LAB_0010320d:
  if (puVar20 != (uint *)0x0) {
    puVar17 = (uint *)0x0;
    pEVar16 = pEVar5;
    lVar7 = lVar6;
    if (puVar21 == (uint *)0x0) goto LAB_001034ad;
    while (lVar7 != 0) {
      pEVar18 = pEVar16 + 1;
      if (lVar7 == 0x6ffffef5) {
        puVar12 = (uint *)(pEVar16->d_un).d_val;
        if ((uint *)0xfeffffffffffffff < puVar12 || puVar12 < puVar4) {
          puVar12 = (uint *)((long)puVar12 + (long)puVar4);
        }
        goto LAB_00103255;
      }
      pEVar16 = pEVar18;
      lVar7 = pEVar18->d_tag;
    }
    puVar12 = (uint *)0x0;
LAB_00103255:
    if (puVar12 == (uint *)0x0) {
      while (lVar6 != 0) {
        if (lVar6 == 4) {
          puVar12 = (uint *)(pEVar5->d_un).d_val;
          if ((uint *)0xfeffffffffffffff < puVar12 || puVar12 < puVar4) {
            puVar12 = (uint *)((long)puVar12 + (long)puVar4);
          }
          goto LAB_001033b8;
        }
        lVar6 = pEVar5[1].d_tag;
        pEVar5 = pEVar5 + 1;
      }
      puVar12 = (uint *)0x0;
LAB_001033b8:
      if (puVar12 != (uint *)0x0) {
        bVar15 = *name;
        if (bVar15 == 0) {
          uVar22 = 0;
        }
        else {
          uVar22 = 0;
          pbVar13 = (byte *)(name + 1);
          do {
            uVar22 = (ulong)bVar15 + uVar22 * 0x10;
            uVar10 = (uint)uVar22 & 0xf0000000;
            uVar22 = ~(ulong)uVar10 & (uVar10 >> 0x18 ^ uVar22);
            bVar15 = *pbVar13;
            pbVar13 = pbVar13 + 1;
          } while (bVar15 != 0);
        }
        uVar10 = *puVar12;
        uVar1 = puVar12[uVar22 % (ulong)uVar10 + 2];
        puVar17 = (uint *)0x0;
        if (uVar1 == 0) goto LAB_001034ad;
        do {
          uVar22 = (ulong)uVar1;
          iVar9 = mmk_streq((char *)((ulong)puVar20[uVar22 * 6] + (long)puVar21),name);
          if (iVar9 != 0) {
            puVar17 = puVar20 + uVar22 * 6;
            goto LAB_001034ad;
          }
          uVar1 = puVar12[(ulong)uVar10 + uVar22 + 2];
        } while (uVar1 != 0);
      }
    }
    else {
      uVar22 = 0x1505;
      bVar15 = *name;
      pbVar13 = (byte *)(name + 1);
      while (uVar10 = (uint)uVar22, bVar15 != 0) {
        uVar22 = (ulong)((uint)bVar15 + uVar10 * 0x21);
        bVar15 = *pbVar13;
        pbVar13 = pbVar13 + 1;
      }
      uVar19 = (ulong)puVar12[2];
      if (((*(ulong *)(puVar12 + ((uVar22 >> 6) % uVar19) * 2 + 4) >> (uVar22 & 0x3f) & 1) != 0) &&
         ((*(ulong *)(puVar12 + ((uVar22 >> 6) % uVar19) * 2 + 4) >>
           ((ulong)(uVar10 >> ((byte)puVar12[3] & 0x1f)) & 0x3f) & 1) != 0)) {
        uVar1 = *puVar12;
        uVar14 = puVar12[uVar19 * 2 + uVar22 % (ulong)uVar1 + 4];
        uVar2 = puVar12[1];
        do {
          uVar3 = puVar12[uVar19 * 2 + (ulong)uVar1 + (ulong)(uVar14 - uVar2) + 4];
          if ((uVar3 ^ uVar10) < 2) {
            iVar9 = strcmp((char *)((ulong)puVar20[(ulong)uVar14 * 6] + (long)puVar21),name);
            if (iVar9 != 0) goto LAB_0010330e;
            puVar17 = puVar20 + (ulong)uVar14 * 6;
            bVar23 = false;
            local_38 = puVar17;
          }
          else {
LAB_0010330e:
            bVar23 = (uVar3 & 1) == 0;
            puVar17 = (uint *)0x0;
            if (bVar23) {
              puVar17 = local_38;
            }
          }
          uVar14 = uVar14 + 1;
        } while (bVar23);
        goto LAB_001034ad;
      }
    }
  }
  puVar17 = (uint *)0x0;
LAB_001034ad:
  if (puVar17 == (uint *)0x0) {
    bVar23 = false;
  }
  else if (*(long *)(puVar17 + 4) == 0) {
    bVar23 = false;
  }
  else {
    local_40 = (undefined1 *)(plVar11->l_addr + *(long *)(puVar17 + 2));
    bVar23 = true;
  }
  if (bVar23) {
    return local_40;
  }
  plVar11 = plVar11->l_next;
  if (plVar11 == (link_map *)0x0) {
    return (undefined1 *)0x0;
  }
  goto LAB_001031b4;
}

Assistant:

plt_fn *plt_get_real_fn(plt_ctx ctx, const char *name)
{
    for (struct link_map *lm = ctx->r_map; lm != NULL; lm = lm->l_next) {
        ElfW(Sym) *sym = sym_lookup_dyn(lm, name);
        if (sym) {
            /* Some compilers (e.g. ICC) put unresolved symbols into the
               symbol table with a size of 0. We ignore them to avoid
               getting the address of the PLT stub. */
            if (sym->st_size == 0)
                continue;

            return (void *) (sym->st_value + lm->l_addr);
        }
    }
    return NULL;
}